

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int Fl_X::xrender_supported(void)

{
  int nop2;
  int nop1;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)(uint)xrender_supported::result;
  if (xrender_supported::result != -1) {
    return xrender_supported::result;
  }
  fl_open_display();
  xrender_supported::result = XRenderQueryExtension(fl_display,(long)&uStack_8 + 4,&uStack_8);
  return xrender_supported::result;
}

Assistant:

int Fl_X::xrender_supported() {
#if HAVE_XRENDER
  static int result = -1;

  if (result == -1) {
    fl_open_display();

    int nop1, nop2;
    result = XRenderQueryExtension(fl_display, &nop1, &nop2);
  }

  return result;
#else
  return 0;
#endif
}